

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetWindowFontScale(float scale)

{
  ImGuiWindow *this;
  ImGuiContext_conflict1 *pIVar1;
  ImGuiContext_conflict1 *g;
  float fVar2;
  
  pIVar1 = GImGui;
  if (0.0 < scale) {
    this = (ImGuiWindow *)GImGui->CurrentWindow;
    this->WriteAccessed = true;
    this->FontWindowScale = scale;
    fVar2 = ImGuiWindow::CalcFontSize(this);
    (pIVar1->DrawListSharedData).FontSize = fVar2;
    pIVar1->FontSize = fVar2;
    return;
  }
  __assert_fail("scale > 0.0f",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x1de4,"void ImGui::SetWindowFontScale(float)");
}

Assistant:

void ImGui::SetWindowFontScale(float scale)
{
    IM_ASSERT(scale > 0.0f);
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    window->FontWindowScale = scale;
    g.FontSize = g.DrawListSharedData.FontSize = window->CalcFontSize();
}